

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

int cpu_restore_state_from_tb
              (CPUState *cpu,TranslationBlock_conflict *tb,uintptr_t searched_pc,_Bool reset_icount)

{
  TranslationBlock_conflict *pTVar1;
  uint uVar2;
  target_long_conflict tVar3;
  TranslationBlock_conflict *pTVar4;
  TranslationBlock_conflict *extraout_RAX;
  void *pvVar5;
  target_ulong_conflict tVar6;
  uint uVar7;
  uint8_t *p;
  target_ulong_conflict local_4c;
  CPUState *local_48;
  CPUTriCoreState *local_40;
  TranslationBlock_conflict *local_38;
  
  tVar6 = tb->pc;
  pvVar5 = (tb->tc).ptr;
  local_40 = (CPUTriCoreState *)cpu->env_ptr;
  pTVar4 = (TranslationBlock_conflict *)((tb->tc).size + (long)pvVar5);
  if (pvVar5 <= (void *)(searched_pc - 2)) {
    pTVar1 = tb;
    uVar2 = (uint)tb->icount;
    local_48 = cpu;
    local_38 = pTVar4;
    do {
      uVar7 = uVar2;
      pTVar4 = pTVar1;
      if (uVar7 == 0) goto LAB_00b356ea;
      tVar3 = decode_sleb128((uint8_t **)&local_38);
      tVar6 = tVar6 + tVar3;
      local_4c = tVar6;
      tVar3 = decode_sleb128((uint8_t **)&local_38);
      pvVar5 = (void *)((long)((TranslationBlock_conflict *)(long)tVar3)->page_next +
                       ((long)pvVar5 - 0x30U));
      pTVar1 = (TranslationBlock_conflict *)(long)tVar3;
      uVar2 = uVar7 - 1;
    } while (pvVar5 <= (void *)(searched_pc - 2));
    if ((reset_icount) && ((tb->cflags & 0x20000) != 0)) {
      *(short *)(local_48[1].tb_jmp_cache + 0xe5) =
           (short)uVar7 + (short)*(undefined4 *)(local_48[1].tb_jmp_cache + 0xe5);
    }
    restore_state_to_opc_tricore(local_40,tb,&local_4c);
    pTVar4 = extraout_RAX;
  }
LAB_00b356ea:
  return (int)pTVar4;
}

Assistant:

static int cpu_restore_state_from_tb(CPUState *cpu, TranslationBlock *tb,
                                     uintptr_t searched_pc, bool reset_icount)
{
    target_ulong data[TARGET_INSN_START_WORDS] = { tb->pc };
    uintptr_t host_pc = (uintptr_t)tb->tc.ptr;
    CPUArchState *env = cpu->env_ptr;
    uint8_t *p = (uint8_t *)tb->tc.ptr + tb->tc.size;
    int i, j, num_insns = tb->icount;

    searched_pc -= GETPC_ADJ;

    if (searched_pc < host_pc) {
        return -1;
    }

    /* Reconstruct the stored insn data while looking for the point at
       which the end of the insn exceeds the searched_pc.  */
    for (i = 0; i < num_insns; ++i) {
        for (j = 0; j < TARGET_INSN_START_WORDS; ++j) {
            data[j] += decode_sleb128(&p);
        }
        host_pc += decode_sleb128(&p);
        if (host_pc > searched_pc) {
            goto found;
        }
    }
    return -1;

 found:
    if (reset_icount && (tb_cflags(tb) & CF_USE_ICOUNT)) {
        /* Reset the cycle counter to the start of the block
           and shift if to the number of actually executed instructions */
        cpu_neg(cpu)->icount_decr.u16.low += num_insns - i;
    }
    restore_state_to_opc(env, tb, data);

    return 0;
}